

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.cpp
# Opt level: O3

uint __thiscall llvm::StringMapImpl::LookupBucketFor(StringMapImpl *this,StringRef Name)

{
  uint uVar1;
  StringMapEntryBase **ppSVar2;
  StringMapEntryBase *pSVar3;
  long lVar4;
  int iVar5;
  size_t sVar6;
  size_t __n;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  
  __n = Name.Length;
  uVar7 = this->NumBuckets;
  if (uVar7 == 0) {
    init(this,(EVP_PKEY_CTX *)0x10);
    uVar7 = this->NumBuckets;
  }
  if (__n == 0) {
    uVar9 = 0;
  }
  else {
    sVar6 = 0;
    uVar9 = 0;
    do {
      uVar9 = uVar9 * 0x21 + (uint)(byte)Name.Data[sVar6];
      sVar6 = sVar6 + 1;
    } while (__n != sVar6);
  }
  ppSVar2 = this->TheTable;
  lVar4 = (ulong)uVar7 * 8 + 8;
  uVar1 = this->ItemSize;
  iVar8 = 1;
  uVar11 = 0xffffffff;
  uVar12 = uVar9;
  do {
    uVar12 = uVar12 & uVar7 - 1;
    uVar13 = (ulong)uVar12;
    pSVar3 = ppSVar2[uVar13];
    uVar10 = (uint)uVar11;
    if (pSVar3 == (StringMapEntryBase *)0x0) {
      if (uVar10 != 0xffffffff) {
        uVar12 = uVar10;
        uVar13 = (long)(int)uVar10;
      }
      *(uint *)((long)ppSVar2 + uVar13 * 4 + lVar4) = uVar9;
      return uVar12;
    }
    if (pSVar3 == (StringMapEntryBase *)0xfffffffffffffff8) {
      if (uVar10 == 0xffffffff) {
        uVar11 = uVar13;
      }
    }
    else if ((*(uint *)((long)ppSVar2 + uVar13 * 4 + lVar4) == uVar9) && (pSVar3->StrLen == __n)) {
      if (__n == 0) {
        return uVar12;
      }
      iVar5 = bcmp(Name.Data,(void *)((long)&pSVar3->StrLen + (ulong)uVar1),__n);
      if (iVar5 == 0) {
        return uVar12;
      }
    }
    uVar12 = uVar12 + iVar8;
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

unsigned StringMapImpl::LookupBucketFor(StringRef Name) {
  unsigned HTSize = NumBuckets;
  if (HTSize == 0) {  // Hash table unallocated so far?
    init(16);
    HTSize = NumBuckets;
  }
  unsigned FullHashValue = djbHash(Name, 0);
  unsigned BucketNo = FullHashValue & (HTSize-1);
  unsigned *HashTable = (unsigned *)(TheTable + NumBuckets + 1);

  unsigned ProbeAmt = 1;
  int FirstTombstone = -1;
  while (true) {
    StringMapEntryBase *BucketItem = TheTable[BucketNo];
    // If we found an empty bucket, this key isn't in the table yet, return it.
    if (LLVM_LIKELY(!BucketItem)) {
      // If we found a tombstone, we want to reuse the tombstone instead of an
      // empty bucket.  This reduces probing.
      if (FirstTombstone != -1) {
        HashTable[FirstTombstone] = FullHashValue;
        return FirstTombstone;
      }

      HashTable[BucketNo] = FullHashValue;
      return BucketNo;
    }

    if (BucketItem == getTombstoneVal()) {
      // Skip over tombstones.  However, remember the first one we see.
      if (FirstTombstone == -1) FirstTombstone = BucketNo;
    } else if (LLVM_LIKELY(HashTable[BucketNo] == FullHashValue)) {
      // If the full hash value matches, check deeply for a match.  The common
      // case here is that we are only looking at the buckets (for item info
      // being non-null and for the full hash value) not at the items.  This
      // is important for cache locality.

      // Do the comparison like this because Name isn't necessarily
      // null-terminated!
      char *ItemStr = (char*)BucketItem+ItemSize;
      if (Name == StringRef(ItemStr, BucketItem->getKeyLength())) {
        // We found a match!
        return BucketNo;
      }
    }

    // Okay, we didn't find the item.  Probe to the next bucket.
    BucketNo = (BucketNo+ProbeAmt) & (HTSize-1);

    // Use quadratic probing, it has fewer clumping artifacts than linear
    // probing and has good cache behavior in the common case.
    ++ProbeAmt;
  }
}